

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O0

float get_active_coin_bias(float k,float avg_loss,float g,float c0)

{
  float *pfVar1;
  float in_XMM0_Da;
  float fVar2;
  double dVar3;
  double dVar4;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float sl;
  float rs;
  float sb;
  float b;
  float local_2c;
  float local_28;
  float local_24;
  float local_1c;
  float local_18;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  local_10 = in_XMM2_Da;
  local_8 = in_XMM0_Da;
  dVar3 = log((double)in_XMM0_Da + 1.0);
  local_18 = (float)(((double)in_XMM3_Da * (dVar3 + 0.0001)) / ((double)local_8 + 0.0001));
  dVar3 = std::sqrt((double)(ulong)(uint)local_18);
  local_1c = SUB84(dVar3,0);
  local_28 = 1.0;
  local_2c = 0.0;
  pfVar1 = std::max<float>(&local_2c,&local_c);
  pfVar1 = std::min<float>(&local_28,pfVar1);
  local_c = *pfVar1;
  dVar3 = std::sqrt((double)(ulong)(uint)local_c);
  dVar4 = std::sqrt((double)(ulong)(uint)(local_c + local_10));
  fVar2 = SUB84(dVar3,0) + SUB84(dVar4,0);
  if (local_1c * fVar2 + local_18 < local_10) {
    local_24 = fVar2;
    dVar3 = std::sqrt((double)(ulong)(uint)(fVar2 * fVar2 + local_10 * 4.0));
    local_4 = (fVar2 + SUB84(dVar3,0)) / (local_10 * 2.0);
    local_4 = local_18 * local_4 * local_4;
  }
  else {
    local_4 = 1.0;
  }
  return local_4;
}

Assistant:

float get_active_coin_bias(float k, float avg_loss, float g, float c0)
{
  float b, sb, rs, sl;
  b = (float)(c0 * (log(k + 1.) + 0.0001) / (k + 0.0001));
  sb = sqrt(b);
  avg_loss = min(1.f, max(0.f, avg_loss));  // loss should be in [0,1]

  sl = sqrt(avg_loss) + sqrt(avg_loss + g);
  if (g <= sb * sl + b)
    return 1;
  rs = (sl + sqrt(sl * sl + 4 * g)) / (2 * g);
  return b * rs * rs;
}